

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O0

void test_bson_writer_shared_buffer(void)

{
  byte bVar1;
  ulong uVar2;
  int local_70;
  int n_docs;
  int j;
  int i;
  char keystr [32];
  undefined8 local_40;
  char *key;
  bson_t *b;
  size_t n_bytes;
  size_t buflen;
  undefined8 uStack_18;
  _Bool rolled_back;
  uint8_t *buf;
  bson_writer_t *writer;
  
  uStack_18 = bson_malloc0(0x20);
  buflen._7_1_ = 0;
  n_bytes = 0x20;
  buf = (uint8_t *)bson_writer_new(&stack0xffffffffffffffe8,&n_bytes,0,bson_realloc_ctx);
  n_docs = 0;
  do {
    if (9999 < n_docs) {
LAB_0013d145:
      b = (bson_t *)bson_writer_get_length(buf);
      bson_writer_destroy(buf);
      if ((bson_t *)0x2ffffff < b) {
        fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)n_bytes < (48 * 1024 * 1024)\n",0x61);
        abort();
      }
      if ((buflen._7_1_ & 1) != 1) {
        fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)rolled_back == true\n",0x62);
        abort();
      }
      if ((buflen._7_1_ & 1) == 0) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
                ,99,"test_bson_writer_shared_buffer","rolled_back");
        abort();
      }
      bson_free(uStack_18);
      return;
    }
    bVar1 = bson_writer_begin(buf,&key);
    if ((bVar1 & 1) == 0) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
              ,0x4d,"test_bson_writer_shared_buffer","bson_writer_begin (writer, &b)");
      abort();
    }
    for (local_70 = 0; local_70 < 1000; local_70 = local_70 + 1) {
      bson_uint32_to_string(local_70,&local_40,&j,0x20);
      bVar1 = bson_append_int64(key,local_40,0xffffffff,(long)local_70);
      if ((bVar1 & 1) == 0) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
                ,0x51,"test_bson_writer_shared_buffer","bson_append_int64 (b, key, -1, j)");
        abort();
      }
    }
    uVar2 = bson_writer_get_length(buf);
    if (0x3000000 < uVar2) {
      buflen._7_1_ = 1;
      bson_writer_rollback(buf);
      goto LAB_0013d145;
    }
    bson_writer_end(buf);
    n_docs = n_docs + 1;
  } while( true );
}

Assistant:

static void
test_bson_writer_shared_buffer (void)
{
   bson_writer_t *writer;
   uint8_t *buf = bson_malloc0 (32);
   bool rolled_back = false;
   size_t buflen = 32;
   size_t n_bytes;
   bson_t *b;
   const char *key;
   char keystr[32];
   int i = 0;
   int j = 0;
   int n_docs = 10000;

   writer = bson_writer_new (&buf, &buflen, 0, bson_realloc_ctx, NULL);

   for (i = 0; i < n_docs; i++) {
      BSON_ASSERT (bson_writer_begin (writer, &b));

      for (j = 0; j < 1000; j++) {
         bson_uint32_to_string (j, &key, keystr, sizeof keystr);
         BSON_ASSERT (bson_append_int64 (b, key, -1, j));
      }

      if (bson_writer_get_length (writer) > (48 * 1024 * 1024)) {
         rolled_back = true;
         bson_writer_rollback (writer);
         break;
      } else {
         bson_writer_end (writer);
      }
   }

   n_bytes = bson_writer_get_length (writer);

   bson_writer_destroy (writer);

   BSON_ASSERT_CMPINT (n_bytes, <, (48 * 1024 * 1024));
   BSON_ASSERT_CMPINT (rolled_back, ==, true);
   BSON_ASSERT (rolled_back);

   bson_free (buf);
}